

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall Reducer::writeAndTestReduction(Reducer *this,ProgramResult *out)

{
  Module *pMVar1;
  bool bVar2;
  ModuleWriter local_d8;
  string local_60 [32];
  string local_40;
  
  local_d8.options = &this->toolOptions->passOptions;
  local_d8.symbolMap._M_dataplus._M_p = (pointer)&local_d8.symbolMap.field_2;
  local_d8.emitModuleName = false;
  local_d8.symbolMap._M_string_length = 0;
  local_d8.symbolMap.field_2._M_local_buf[0] = '\0';
  local_d8.sourceMapFilename._M_dataplus._M_p = (pointer)&local_d8.sourceMapFilename.field_2;
  local_d8.sourceMapFilename._M_string_length = 0;
  local_d8.sourceMapFilename.field_2._M_local_buf[0] = '\0';
  local_d8.sourceMapUrl._M_dataplus._M_p = (pointer)&local_d8.sourceMapUrl.field_2;
  local_d8.sourceMapUrl._M_string_length = 0;
  local_d8.sourceMapUrl.field_2._M_local_buf[0] = '\0';
  local_d8.binary = this->binary;
  local_d8.super_ModuleIOBase.debugInfo = this->debugInfo;
  pMVar1 = (this->
           super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
           ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
           super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.currModule;
  std::__cxx11::string::string(local_60,(string *)&this->test);
  wasm::ModuleWriter::write(&local_d8,pMVar1,local_60);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string((string *)&local_40,(string *)&this->command);
  ProgramResult::getFromExecution(out,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = ProgramResult::operator==(out,&expected);
  wasm::ModuleWriter::~ModuleWriter(&local_d8);
  return bVar2;
}

Assistant:

bool writeAndTestReduction(ProgramResult& out) {
    // write the module out
    ModuleWriter writer(toolOptions.passOptions);
    writer.setBinary(binary);
    writer.setDebugInfo(debugInfo);
    writer.write(*getModule(), test);
    // note that it is ok for the destructively-reduced module to be bigger
    // than the previous - each destructive reduction removes logical code,
    // and so is strictly better, even if the wasm binary format happens to
    // encode things slightly less efficiently.
    // test it
    out.getFromExecution(command);
    return out == expected;
  }